

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O3

void Exp_Truth8(int nVars,Vec_Int_t *p,word **puFanins,word *puRes)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  uint *puVar4;
  long lVar5;
  uint *__ptr;
  uint *puVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  word *pwVar10;
  word *pwVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  word *puFaninsInt [8];
  word Truth8 [8] [4];
  word *local_178;
  long alStack_170 [7];
  undefined1 local_138 [264];
  
  memcpy(local_138,&DAT_009fc190,0x100);
  uVar13 = p->nSize;
  uVar14 = (ulong)uVar13;
  if ((int)uVar13 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x203,"int Vec_IntEntryLast(Vec_Int_t *)");
  }
  piVar3 = p->pArray;
  uVar1 = piVar3[uVar14 - 1];
  if (puFanins == (word **)0x0) {
    lVar15 = 0;
    lVar17 = 1;
    lVar5 = 0;
    auVar18._8_4_ = (int)local_138;
    auVar18._0_8_ = local_138;
    auVar18._12_4_ = (int)((ulong)local_138 >> 0x20);
    puFanins = &local_178;
    do {
      alStack_170[lVar5 + -1] = (long)(local_138 + lVar15 * 0x20);
      alStack_170[lVar5] = lVar17 * 0x20 + auVar18._8_8_;
      lVar5 = lVar5 + 2;
      lVar15 = lVar15 + 2;
      lVar17 = lVar17 + 2;
    } while (lVar5 != 8);
  }
  if (uVar13 == 1) {
    if (SBORROW4(uVar1,nVars * 2) == (int)(uVar1 + nVars * -2) < 0) {
      __assert_fail("iRoot < 2 * nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mio/exp.h"
                    ,0xe3,"void Exp_Truth8(int, Vec_Int_t *, word **, word *)");
    }
    if (uVar1 < 0xfffffffe) {
      if ((int)uVar1 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      pwVar10 = puFanins[uVar1 >> 1];
      lVar5 = 0;
      do {
        puRes[lVar5] = pwVar10[lVar5] ^ -(ulong)(uVar1 & 1);
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
    }
    else {
      lVar5 = -(ulong)(uVar1 != 0xffffffff);
      auVar16._8_4_ = (int)lVar5;
      auVar16._0_8_ = lVar5;
      auVar16._12_4_ = (int)((ulong)lVar5 >> 0x20);
      *(undefined1 (*) [16])puRes = auVar16;
      *(undefined1 (*) [16])(puRes + 2) = auVar16;
    }
  }
  else {
    uVar13 = uVar13 >> 1;
    __ptr = (uint *)calloc((ulong)uVar13 * 4,8);
    uVar9 = 0;
    puVar4 = __ptr;
    do {
      puVar6 = puVar4;
      uVar8 = uVar9;
      if (uVar14 <= uVar8 * 2) {
LAB_0053620a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar12 = piVar3[uVar8 * 2];
      if ((int)uVar12 < 0) goto LAB_005361eb;
      uVar9 = uVar8 * 2 | 1;
      if (uVar14 <= uVar9) goto LAB_0053620a;
      uVar2 = piVar3[uVar9];
      if ((int)uVar2 < 0) goto LAB_005361eb;
      uVar7 = uVar12 >> 1;
      if ((int)uVar7 < nVars) {
        pwVar10 = puFanins[uVar7];
      }
      else {
        pwVar10 = (word *)(__ptr + (long)(int)((uVar7 - nVars) * 4) * 2);
      }
      uVar7 = uVar2 >> 1;
      if ((int)uVar7 < nVars) {
        pwVar11 = puFanins[uVar7];
      }
      else {
        pwVar11 = (word *)(__ptr + (long)(int)((uVar7 - nVars) * 4) * 2);
      }
      uVar12 = uVar12 & 1;
      if ((uVar12 & uVar2) == 0) {
        if ((uVar12 == 0) || ((uVar2 & 1) != 0)) {
          if ((uVar12 == 0) && ((uVar2 & 1) != 0)) {
            lVar5 = 0;
            do {
              *(word *)(puVar6 + lVar5 * 2) = ~pwVar11[lVar5] & pwVar10[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 4);
          }
          else {
            lVar5 = 0;
            do {
              *(word *)(puVar6 + lVar5 * 2) = pwVar11[lVar5] & pwVar10[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar5 != 4);
          }
        }
        else {
          lVar5 = 0;
          do {
            *(word *)(puVar6 + lVar5 * 2) = ~pwVar10[lVar5] & pwVar11[lVar5];
            lVar5 = lVar5 + 1;
          } while (lVar5 != 4);
        }
      }
      else {
        lVar5 = 0;
        do {
          *(word *)(puVar6 + lVar5 * 2) = ~(pwVar11[lVar5] | pwVar10[lVar5]);
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
      }
      uVar9 = uVar8 + 1;
      puVar4 = puVar6 + 8;
    } while (uVar8 + 1 != (ulong)(uVar13 + (uVar13 == 0)));
    if ((int)uVar1 < 0) {
LAB_005361eb:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    if ((uVar1 >> 1) - nVars != (int)uVar8) {
      __assert_fail("Abc_Lit2Var(iRoot) - nVars == i - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mio/exp.h"
                    ,0x103,"void Exp_Truth8(int, Vec_Int_t *, word **, word *)");
    }
    uVar1 = uVar1 & 1;
    lVar5 = 0;
    do {
      uVar13 = puVar6[1];
      uVar12 = puVar6[2];
      uVar2 = puVar6[3];
      pwVar10 = puRes + lVar5;
      *(uint *)pwVar10 = *puVar6 ^ -uVar1;
      *(uint *)((long)pwVar10 + 4) = uVar13 ^ -uVar1;
      *(uint *)(pwVar10 + 1) = uVar12 ^ -uVar1;
      *(uint *)((long)pwVar10 + 0xc) = uVar2 ^ -uVar1;
      lVar5 = lVar5 + 2;
      puVar6 = puVar6 + 4;
    } while (lVar5 != 4);
    free(__ptr);
  }
  return;
}

Assistant:

static inline void Exp_Truth8( int nVars, Vec_Int_t * p, word ** puFanins, word * puRes )
{
    word Truth8[8][4] = {
        { ABC_CONST(0xAAAAAAAAAAAAAAAA),ABC_CONST(0xAAAAAAAAAAAAAAAA),ABC_CONST(0xAAAAAAAAAAAAAAAA),ABC_CONST(0xAAAAAAAAAAAAAAAA) },
        { ABC_CONST(0xCCCCCCCCCCCCCCCC),ABC_CONST(0xCCCCCCCCCCCCCCCC),ABC_CONST(0xCCCCCCCCCCCCCCCC),ABC_CONST(0xCCCCCCCCCCCCCCCC) },
        { ABC_CONST(0xF0F0F0F0F0F0F0F0),ABC_CONST(0xF0F0F0F0F0F0F0F0),ABC_CONST(0xF0F0F0F0F0F0F0F0),ABC_CONST(0xF0F0F0F0F0F0F0F0) },
        { ABC_CONST(0xFF00FF00FF00FF00),ABC_CONST(0xFF00FF00FF00FF00),ABC_CONST(0xFF00FF00FF00FF00),ABC_CONST(0xFF00FF00FF00FF00) },
        { ABC_CONST(0xFFFF0000FFFF0000),ABC_CONST(0xFFFF0000FFFF0000),ABC_CONST(0xFFFF0000FFFF0000),ABC_CONST(0xFFFF0000FFFF0000) },
        { ABC_CONST(0xFFFFFFFF00000000),ABC_CONST(0xFFFFFFFF00000000),ABC_CONST(0xFFFFFFFF00000000),ABC_CONST(0xFFFFFFFF00000000) },
        { ABC_CONST(0x0000000000000000),ABC_CONST(0xFFFFFFFFFFFFFFFF),ABC_CONST(0x0000000000000000),ABC_CONST(0xFFFFFFFFFFFFFFFF) },
        { ABC_CONST(0x0000000000000000),ABC_CONST(0x0000000000000000),ABC_CONST(0xFFFFFFFFFFFFFFFF),ABC_CONST(0xFFFFFFFFFFFFFFFF) }
    };
    word * puFaninsInt[8], * pStore, * pThis = NULL;
    int i, k, iRoot = Vec_IntEntryLast(p);
    if ( puFanins == NULL )
    {
        puFanins = puFaninsInt;
        for ( k = 0; k < 8; k++ )
            puFanins[k] = Truth8[k];
    }
    if ( Exp_NodeNum(p) == 0 )
    {
        assert( iRoot < 2 * nVars );
        if ( iRoot == EXP_CONST0 || iRoot == EXP_CONST1 )
            for ( k = 0; k < 4; k++ )
                puRes[k] = iRoot == EXP_CONST0 ? 0 : ~(word)0;
        else
            for ( k = 0; k < 4; k++ )
                puRes[k] = Abc_LitIsCompl(iRoot) ? ~puFanins[Abc_Lit2Var(iRoot)][k] : puFanins[Abc_Lit2Var(iRoot)][k];
        return;
    }
    pStore = ABC_CALLOC( word, 4 * Exp_NodeNum(p) );
    for ( i = 0; i < Exp_NodeNum(p); i++ )
    {
        int iVar0 = Abc_Lit2Var( Vec_IntEntry(p, 2*i+0) );
        int iVar1 = Abc_Lit2Var( Vec_IntEntry(p, 2*i+1) );
        int fCompl0 = Abc_LitIsCompl( Vec_IntEntry(p, 2*i+0) );
        int fCompl1 = Abc_LitIsCompl( Vec_IntEntry(p, 2*i+1) );
        word * pIn0 = iVar0 < nVars ? puFanins[iVar0] : pStore + 4 * (iVar0 - nVars);
        word * pIn1 = iVar1 < nVars ? puFanins[iVar1] : pStore + 4 * (iVar1 - nVars);
        pThis = pStore + 4 * i;
        if ( fCompl0 && fCompl1 )
            for ( k = 0; k < 4; k++ )
                pThis[k] = ~pIn0[k] & ~pIn1[k];
        else if ( fCompl0 && !fCompl1 )
            for ( k = 0; k < 4; k++ )
                pThis[k] = ~pIn0[k] &  pIn1[k];
        else if ( !fCompl0 && fCompl1 )
            for ( k = 0; k < 4; k++ )
                pThis[k] =  pIn0[k] & ~pIn1[k];
        else //if ( !fCompl0 && !fCompl1 )
            for ( k = 0; k < 4; k++ )
                pThis[k] =  pIn0[k] &  pIn1[k];
    }
    assert( Abc_Lit2Var(iRoot) - nVars == i - 1 );
    for ( k = 0; k < 4; k++ )
        puRes[k] = Abc_LitIsCompl(iRoot) ? ~pThis[k] : pThis[k];
    ABC_FREE( pStore );
}